

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void highbd_filter4_dual_sse2
               (__m128i *p,__m128i *q,__m128i *ps,__m128i *qs,__m128i *mask,__m128i *th,int bd,
               __m128i *t80)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  ulong *in_R8;
  undefined1 (*in_R9) [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  __m128i abs_p1p0;
  __m128i hev;
  __m128i filter;
  __m128i pmin;
  __m128i zero;
  __m128i pmax;
  __m128i one;
  __m128i qs1;
  __m128i qs0;
  __m128i ps1;
  __m128i ps0;
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined1 local_9a8 [16];
  undefined8 local_998;
  undefined8 uStack_990;
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  short local_868;
  short sStack_866;
  short sStack_864;
  short sStack_862;
  short sStack_860;
  short sStack_85e;
  short sStack_85c;
  short sStack_85a;
  uint local_848;
  uint uStack_844;
  uint uStack_840;
  uint uStack_83c;
  uint local_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  ulong local_7e8;
  ulong uStack_7e0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7a8;
  ulong uStack_7a0;
  ulong local_798;
  ulong uStack_790;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  short local_6b8;
  short sStack_6b6;
  short sStack_6b4;
  short sStack_6b2;
  short sStack_6b0;
  short sStack_6ae;
  short sStack_6ac;
  short sStack_6aa;
  short local_4b8;
  short sStack_4b6;
  short sStack_4b4;
  short sStack_4b2;
  short sStack_4b0;
  short sStack_4ae;
  short sStack_4ac;
  short sStack_4aa;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  short local_438;
  short sStack_436;
  short sStack_434;
  short sStack_432;
  short sStack_430;
  short sStack_42e;
  short sStack_42c;
  short sStack_42a;
  short local_3f8;
  short sStack_3f6;
  short sStack_3f4;
  short sStack_3f2;
  short sStack_3f0;
  short sStack_3ee;
  short sStack_3ec;
  short sStack_3ea;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  short local_2f8;
  short sStack_2f6;
  short sStack_2f4;
  short sStack_2f2;
  short sStack_2f0;
  short sStack_2ee;
  short sStack_2ec;
  short sStack_2ea;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  __m128i filter2;
  __m128i filter1;
  __m128i t4;
  __m128i t3;
  __m128i x;
  __m128i ffff;
  __m128i h;
  __m128i abs_q1q0;
  
  auVar8 = psubsw(*in_RDI,*(undefined1 (*) [16])hev[0]);
  auVar9 = psubsw(in_RDI[1],*(undefined1 (*) [16])hev[0]);
  auVar10 = psubsw(*in_RSI,*(undefined1 (*) [16])hev[0]);
  auVar11 = psubsw(in_RSI[1],*(undefined1 (*) [16])hev[0]);
  auVar13._8_8_ = 0x1000100010001;
  auVar13._0_8_ = 0x1000100010001;
  auVar13 = psllw(auVar13,ZEXT416((uint)abs_p1p0[1]));
  auVar1._8_8_ = 0x1000100010001;
  auVar1._0_8_ = 0x1000100010001;
  auVar13 = psubsw(auVar13,auVar1);
  auVar13 = psubsw(auVar13,*(undefined1 (*) [16])hev[0]);
  psubsw(ZEXT816(0),*(undefined1 (*) [16])hev[0]);
  local_9a8 = psubsw(auVar9,auVar11);
  local_f8 = local_9a8._0_2_;
  sStack_f6 = local_9a8._2_2_;
  sStack_f4 = local_9a8._4_2_;
  sStack_f2 = local_9a8._6_2_;
  sStack_f0 = local_9a8._8_2_;
  sStack_ee = local_9a8._10_2_;
  sStack_ec = local_9a8._12_2_;
  sStack_ea = local_9a8._14_2_;
  local_108 = auVar13._0_2_;
  sStack_106 = auVar13._2_2_;
  sStack_104 = auVar13._4_2_;
  sStack_102 = auVar13._6_2_;
  sStack_100 = auVar13._8_2_;
  sStack_fe = auVar13._10_2_;
  sStack_fc = auVar13._12_2_;
  sStack_fa = auVar13._14_2_;
  local_9a8._0_2_ =
       (ushort)(local_108 < local_f8) * local_108 | (ushort)(local_108 >= local_f8) * local_f8;
  local_9a8._2_2_ =
       (ushort)(sStack_106 < sStack_f6) * sStack_106 | (ushort)(sStack_106 >= sStack_f6) * sStack_f6
  ;
  local_9a8._4_2_ =
       (ushort)(sStack_104 < sStack_f4) * sStack_104 | (ushort)(sStack_104 >= sStack_f4) * sStack_f4
  ;
  local_9a8._6_2_ =
       (ushort)(sStack_102 < sStack_f2) * sStack_102 | (ushort)(sStack_102 >= sStack_f2) * sStack_f2
  ;
  local_9a8._8_2_ =
       (ushort)(sStack_100 < sStack_f0) * sStack_100 | (ushort)(sStack_100 >= sStack_f0) * sStack_f0
  ;
  local_9a8._10_2_ =
       (ushort)(sStack_fe < sStack_ee) * sStack_fe | (ushort)(sStack_fe >= sStack_ee) * sStack_ee;
  local_9a8._12_2_ =
       (ushort)(sStack_fc < sStack_ec) * sStack_fc | (ushort)(sStack_fc >= sStack_ec) * sStack_ec;
  local_9a8._14_2_ =
       (ushort)(sStack_fa < sStack_ea) * sStack_fa | (ushort)(sStack_fa >= sStack_ea) * sStack_ea;
  local_2f8 = local_9a8._0_2_;
  sStack_2f6 = local_9a8._2_2_;
  sStack_2f4 = local_9a8._4_2_;
  sStack_2f2 = local_9a8._6_2_;
  sStack_2f0 = local_9a8._8_2_;
  sStack_2ee = local_9a8._10_2_;
  sStack_2ec = local_9a8._12_2_;
  sStack_2ea = local_9a8._14_2_;
  local_308 = (short)local_998;
  sStack_306 = (short)((ulong)local_998 >> 0x10);
  sStack_304 = (short)((ulong)local_998 >> 0x20);
  sStack_302 = (short)((ulong)local_998 >> 0x30);
  sStack_300 = (short)uStack_990;
  sStack_2fe = (short)((ulong)uStack_990 >> 0x10);
  sStack_2fc = (short)((ulong)uStack_990 >> 0x20);
  sStack_2fa = (short)((ulong)uStack_990 >> 0x30);
  local_9a8._0_2_ =
       (ushort)(local_2f8 < local_308) * local_308 | (ushort)(local_2f8 >= local_308) * local_2f8;
  local_9a8._2_2_ =
       (ushort)(sStack_2f6 < sStack_306) * sStack_306 |
       (ushort)(sStack_2f6 >= sStack_306) * sStack_2f6;
  local_9a8._4_2_ =
       (ushort)(sStack_2f4 < sStack_304) * sStack_304 |
       (ushort)(sStack_2f4 >= sStack_304) * sStack_2f4;
  local_9a8._6_2_ =
       (ushort)(sStack_2f2 < sStack_302) * sStack_302 |
       (ushort)(sStack_2f2 >= sStack_302) * sStack_2f2;
  local_9a8._8_2_ =
       (ushort)(sStack_2f0 < sStack_300) * sStack_300 |
       (ushort)(sStack_2f0 >= sStack_300) * sStack_2f0;
  local_9a8._10_2_ =
       (ushort)(sStack_2ee < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_2ee >= sStack_2fe) * sStack_2ee;
  local_9a8._12_2_ =
       (ushort)(sStack_2ec < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_2ec >= sStack_2fc) * sStack_2ec;
  local_9a8._14_2_ =
       (ushort)(sStack_2ea < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_2ea >= sStack_2fa) * sStack_2ea;
  auVar14 = psubusw(in_RDI[1],*in_RDI);
  auVar13 = psubusw(*in_RDI,in_RDI[1]);
  local_798 = auVar14._0_8_;
  uStack_790 = auVar14._8_8_;
  local_7a8 = auVar13._0_8_;
  uStack_7a0 = auVar13._8_8_;
  local_798 = local_798 | local_7a8;
  uStack_790 = uStack_790 | uStack_7a0;
  auVar14 = psubusw(in_RSI[1],*in_RSI);
  auVar13 = psubusw(*in_RSI,in_RSI[1]);
  local_7d8 = auVar14._0_8_;
  uStack_7d0 = auVar14._8_8_;
  local_7e8 = auVar13._0_8_;
  uStack_7e0 = auVar13._8_8_;
  local_7d8 = local_7d8 | local_7e8;
  uStack_7d0 = uStack_7d0 | uStack_7e0;
  local_6b8 = (short)local_798;
  sStack_6b6 = (short)(local_798 >> 0x10);
  sStack_6b4 = (short)(local_798 >> 0x20);
  sStack_6b2 = (short)(local_798 >> 0x30);
  sStack_6b0 = (short)uStack_790;
  sStack_6ae = (short)(uStack_790 >> 0x10);
  sStack_6ac = (short)(uStack_790 >> 0x20);
  sStack_6aa = (short)(uStack_790 >> 0x30);
  local_6c8 = (short)local_7d8;
  sStack_6c6 = (short)(local_7d8 >> 0x10);
  sStack_6c4 = (short)(local_7d8 >> 0x20);
  sStack_6c2 = (short)(local_7d8 >> 0x30);
  sStack_6c0 = (short)uStack_7d0;
  sStack_6be = (short)(uStack_7d0 >> 0x10);
  sStack_6bc = (short)(uStack_7d0 >> 0x20);
  sStack_6ba = (short)(uStack_7d0 >> 0x30);
  local_9e8._0_4_ =
       CONCAT22((ushort)(sStack_6b6 < sStack_6c6) * sStack_6c6 |
                (ushort)(sStack_6b6 >= sStack_6c6) * sStack_6b6,
                (ushort)(local_6b8 < local_6c8) * local_6c8 |
                (ushort)(local_6b8 >= local_6c8) * local_6b8);
  local_9e8._0_6_ =
       CONCAT24((ushort)(sStack_6b4 < sStack_6c4) * sStack_6c4 |
                (ushort)(sStack_6b4 >= sStack_6c4) * sStack_6b4,(undefined4)local_9e8);
  local_9e8 = CONCAT26((ushort)(sStack_6b2 < sStack_6c2) * sStack_6c2 |
                       (ushort)(sStack_6b2 >= sStack_6c2) * sStack_6b2,(undefined6)local_9e8);
  uStack_9e0._0_2_ =
       (ushort)(sStack_6b0 < sStack_6c0) * sStack_6c0 |
       (ushort)(sStack_6b0 >= sStack_6c0) * sStack_6b0;
  uStack_9e0._2_2_ =
       (ushort)(sStack_6ae < sStack_6be) * sStack_6be |
       (ushort)(sStack_6ae >= sStack_6be) * sStack_6ae;
  uStack_9e0._4_2_ =
       (ushort)(sStack_6ac < sStack_6bc) * sStack_6bc |
       (ushort)(sStack_6ac >= sStack_6bc) * sStack_6ac;
  uStack_9e0._6_2_ =
       (ushort)(sStack_6aa < sStack_6ba) * sStack_6ba |
       (ushort)(sStack_6aa >= sStack_6ba) * sStack_6aa;
  auVar14._8_8_ = uStack_9e0;
  auVar14._0_8_ = local_9e8;
  auVar13 = psubusw(auVar14,*in_R9);
  local_868 = auVar13._0_2_;
  sStack_866 = auVar13._2_2_;
  sStack_864 = auVar13._4_2_;
  sStack_862 = auVar13._6_2_;
  sStack_860 = auVar13._8_2_;
  sStack_85e = auVar13._10_2_;
  sStack_85c = auVar13._12_2_;
  sStack_85a = auVar13._14_2_;
  uVar7 = CONCAT26(-(ushort)(sStack_862 == 0),
                   CONCAT24(-(ushort)(sStack_864 == 0),
                            CONCAT22(-(ushort)(sStack_866 == 0),-(ushort)(local_868 == 0)))) ^
          0xffffffffffffffff;
  uVar12 = CONCAT26(-(ushort)(sStack_85a == 0),
                    CONCAT24(-(ushort)(sStack_85c == 0),
                             CONCAT22(-(ushort)(sStack_85e == 0),-(ushort)(sStack_860 == 0)))) ^
           0xffffffffffffffff;
  local_9a8._0_8_ = SUB168(local_9a8,0);
  local_9a8._8_8_ = SUB168(local_9a8,8);
  auVar13 = psubsw(auVar10,auVar8);
  auVar6._8_8_ = local_9a8._8_8_ & uVar12;
  auVar6._0_8_ = local_9a8._0_8_ & uVar7;
  auVar14 = paddsw(auVar6,auVar13);
  auVar14 = paddsw(auVar14,auVar13);
  local_9a8 = paddsw(auVar14,auVar13);
  local_d8 = local_9a8._0_2_;
  sStack_d6 = local_9a8._2_2_;
  sStack_d4 = local_9a8._4_2_;
  sStack_d2 = local_9a8._6_2_;
  sStack_d0 = local_9a8._8_2_;
  sStack_ce = local_9a8._10_2_;
  sStack_cc = local_9a8._12_2_;
  sStack_ca = local_9a8._14_2_;
  local_9a8._0_2_ =
       (ushort)(local_108 < local_d8) * local_108 | (ushort)(local_108 >= local_d8) * local_d8;
  local_9a8._2_2_ =
       (ushort)(sStack_106 < sStack_d6) * sStack_106 | (ushort)(sStack_106 >= sStack_d6) * sStack_d6
  ;
  local_9a8._4_2_ =
       (ushort)(sStack_104 < sStack_d4) * sStack_104 | (ushort)(sStack_104 >= sStack_d4) * sStack_d4
  ;
  local_9a8._6_2_ =
       (ushort)(sStack_102 < sStack_d2) * sStack_102 | (ushort)(sStack_102 >= sStack_d2) * sStack_d2
  ;
  local_9a8._8_2_ =
       (ushort)(sStack_100 < sStack_d0) * sStack_100 | (ushort)(sStack_100 >= sStack_d0) * sStack_d0
  ;
  local_9a8._10_2_ =
       (ushort)(sStack_fe < sStack_ce) * sStack_fe | (ushort)(sStack_fe >= sStack_ce) * sStack_ce;
  local_9a8._12_2_ =
       (ushort)(sStack_fc < sStack_cc) * sStack_fc | (ushort)(sStack_fc >= sStack_cc) * sStack_cc;
  local_9a8._14_2_ =
       (ushort)(sStack_fa < sStack_ca) * sStack_fa | (ushort)(sStack_fa >= sStack_ca) * sStack_ca;
  local_338 = local_9a8._0_2_;
  sStack_336 = local_9a8._2_2_;
  sStack_334 = local_9a8._4_2_;
  sStack_332 = local_9a8._6_2_;
  sStack_330 = local_9a8._8_2_;
  sStack_32e = local_9a8._10_2_;
  sStack_32c = local_9a8._12_2_;
  sStack_32a = local_9a8._14_2_;
  local_9a8._0_2_ =
       (ushort)(local_338 < local_308) * local_308 | (ushort)(local_338 >= local_308) * local_338;
  local_9a8._2_2_ =
       (ushort)(sStack_336 < sStack_306) * sStack_306 |
       (ushort)(sStack_336 >= sStack_306) * sStack_336;
  local_9a8._4_2_ =
       (ushort)(sStack_334 < sStack_304) * sStack_304 |
       (ushort)(sStack_334 >= sStack_304) * sStack_334;
  local_9a8._6_2_ =
       (ushort)(sStack_332 < sStack_302) * sStack_302 |
       (ushort)(sStack_332 >= sStack_302) * sStack_332;
  local_9a8._8_2_ =
       (ushort)(sStack_330 < sStack_300) * sStack_300 |
       (ushort)(sStack_330 >= sStack_300) * sStack_330;
  local_9a8._10_2_ =
       (ushort)(sStack_32e < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_32e >= sStack_2fe) * sStack_32e;
  local_9a8._12_2_ =
       (ushort)(sStack_32c < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_32c >= sStack_2fc) * sStack_32c;
  local_9a8._14_2_ =
       (ushort)(sStack_32a < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_32a >= sStack_2fa) * sStack_32a;
  local_9a8._0_8_ = SUB168(local_9a8,0);
  local_9a8._8_8_ = SUB168(local_9a8,8);
  auVar5._8_8_ = local_9a8._8_8_ & in_R8[1];
  auVar5._0_8_ = local_9a8._0_8_ & *in_R8;
  auVar4._8_8_ = 0x4000400040004;
  auVar4._0_8_ = 0x4000400040004;
  local_a38 = paddsw(auVar5,auVar4);
  auVar3._8_8_ = local_9a8._8_8_ & in_R8[1];
  auVar3._0_8_ = local_9a8._0_8_ & *in_R8;
  auVar2._8_8_ = 0x3000300030003;
  auVar2._0_8_ = 0x3000300030003;
  local_a48 = paddsw(auVar3,auVar2);
  local_b8 = local_a38._0_2_;
  sStack_b6 = local_a38._2_2_;
  sStack_b4 = local_a38._4_2_;
  sStack_b2 = local_a38._6_2_;
  sStack_b0 = local_a38._8_2_;
  sStack_ae = local_a38._10_2_;
  sStack_ac = local_a38._12_2_;
  sStack_aa = local_a38._14_2_;
  local_a38._0_2_ =
       (ushort)(local_108 < local_b8) * local_108 | (ushort)(local_108 >= local_b8) * local_b8;
  local_a38._2_2_ =
       (ushort)(sStack_106 < sStack_b6) * sStack_106 | (ushort)(sStack_106 >= sStack_b6) * sStack_b6
  ;
  local_a38._4_2_ =
       (ushort)(sStack_104 < sStack_b4) * sStack_104 | (ushort)(sStack_104 >= sStack_b4) * sStack_b4
  ;
  local_a38._6_2_ =
       (ushort)(sStack_102 < sStack_b2) * sStack_102 | (ushort)(sStack_102 >= sStack_b2) * sStack_b2
  ;
  local_a38._8_2_ =
       (ushort)(sStack_100 < sStack_b0) * sStack_100 | (ushort)(sStack_100 >= sStack_b0) * sStack_b0
  ;
  local_a38._10_2_ =
       (ushort)(sStack_fe < sStack_ae) * sStack_fe | (ushort)(sStack_fe >= sStack_ae) * sStack_ae;
  local_a38._12_2_ =
       (ushort)(sStack_fc < sStack_ac) * sStack_fc | (ushort)(sStack_fc >= sStack_ac) * sStack_ac;
  local_a38._14_2_ =
       (ushort)(sStack_fa < sStack_aa) * sStack_fa | (ushort)(sStack_fa >= sStack_aa) * sStack_aa;
  local_378 = local_a38._0_2_;
  sStack_376 = local_a38._2_2_;
  sStack_374 = local_a38._4_2_;
  sStack_372 = local_a38._6_2_;
  sStack_370 = local_a38._8_2_;
  sStack_36e = local_a38._10_2_;
  sStack_36c = local_a38._12_2_;
  sStack_36a = local_a38._14_2_;
  local_a38._0_2_ =
       (ushort)(local_378 < local_308) * local_308 | (ushort)(local_378 >= local_308) * local_378;
  local_a38._2_2_ =
       (ushort)(sStack_376 < sStack_306) * sStack_306 |
       (ushort)(sStack_376 >= sStack_306) * sStack_376;
  local_a38._4_2_ =
       (ushort)(sStack_374 < sStack_304) * sStack_304 |
       (ushort)(sStack_374 >= sStack_304) * sStack_374;
  local_a38._6_2_ =
       (ushort)(sStack_372 < sStack_302) * sStack_302 |
       (ushort)(sStack_372 >= sStack_302) * sStack_372;
  local_a38._8_2_ =
       (ushort)(sStack_370 < sStack_300) * sStack_300 |
       (ushort)(sStack_370 >= sStack_300) * sStack_370;
  local_a38._10_2_ =
       (ushort)(sStack_36e < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_36e >= sStack_2fe) * sStack_36e;
  local_a38._12_2_ =
       (ushort)(sStack_36c < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_36c >= sStack_2fc) * sStack_36c;
  local_a38._14_2_ =
       (ushort)(sStack_36a < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_36a >= sStack_2fa) * sStack_36a;
  local_98 = local_a48._0_2_;
  sStack_96 = local_a48._2_2_;
  sStack_94 = local_a48._4_2_;
  sStack_92 = local_a48._6_2_;
  sStack_90 = local_a48._8_2_;
  sStack_8e = local_a48._10_2_;
  sStack_8c = local_a48._12_2_;
  sStack_8a = local_a48._14_2_;
  local_a48._0_2_ =
       (ushort)(local_108 < local_98) * local_108 | (ushort)(local_108 >= local_98) * local_98;
  local_a48._2_2_ =
       (ushort)(sStack_106 < sStack_96) * sStack_106 | (ushort)(sStack_106 >= sStack_96) * sStack_96
  ;
  local_a48._4_2_ =
       (ushort)(sStack_104 < sStack_94) * sStack_104 | (ushort)(sStack_104 >= sStack_94) * sStack_94
  ;
  local_a48._6_2_ =
       (ushort)(sStack_102 < sStack_92) * sStack_102 | (ushort)(sStack_102 >= sStack_92) * sStack_92
  ;
  local_a48._8_2_ =
       (ushort)(sStack_100 < sStack_90) * sStack_100 | (ushort)(sStack_100 >= sStack_90) * sStack_90
  ;
  local_a48._10_2_ =
       (ushort)(sStack_fe < sStack_8e) * sStack_fe | (ushort)(sStack_fe >= sStack_8e) * sStack_8e;
  local_a48._12_2_ =
       (ushort)(sStack_fc < sStack_8c) * sStack_fc | (ushort)(sStack_fc >= sStack_8c) * sStack_8c;
  local_a48._14_2_ =
       (ushort)(sStack_fa < sStack_8a) * sStack_fa | (ushort)(sStack_fa >= sStack_8a) * sStack_8a;
  local_3b8 = local_a48._0_2_;
  sStack_3b6 = local_a48._2_2_;
  sStack_3b4 = local_a48._4_2_;
  sStack_3b2 = local_a48._6_2_;
  sStack_3b0 = local_a48._8_2_;
  sStack_3ae = local_a48._10_2_;
  sStack_3ac = local_a48._12_2_;
  sStack_3aa = local_a48._14_2_;
  local_a48._0_2_ =
       (ushort)(local_3b8 < local_308) * local_308 | (ushort)(local_3b8 >= local_308) * local_3b8;
  local_a48._2_2_ =
       (ushort)(sStack_3b6 < sStack_306) * sStack_306 |
       (ushort)(sStack_3b6 >= sStack_306) * sStack_3b6;
  local_a48._4_2_ =
       (ushort)(sStack_3b4 < sStack_304) * sStack_304 |
       (ushort)(sStack_3b4 >= sStack_304) * sStack_3b4;
  local_a48._6_2_ =
       (ushort)(sStack_3b2 < sStack_302) * sStack_302 |
       (ushort)(sStack_3b2 >= sStack_302) * sStack_3b2;
  local_a48._8_2_ =
       (ushort)(sStack_3b0 < sStack_300) * sStack_300 |
       (ushort)(sStack_3b0 >= sStack_300) * sStack_3b0;
  local_a48._10_2_ =
       (ushort)(sStack_3ae < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_3ae >= sStack_2fe) * sStack_3ae;
  local_a48._12_2_ =
       (ushort)(sStack_3ac < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_3ac >= sStack_2fc) * sStack_3ac;
  local_a48._14_2_ =
       (ushort)(sStack_3aa < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_3aa >= sStack_2fa) * sStack_3aa;
  auVar13 = psraw(local_a38,ZEXT416(3));
  auVar14 = psraw(local_a48,ZEXT416(3));
  local_948 = psubsw(auVar10,auVar13);
  filter2[1]._0_2_ = local_948._0_2_;
  filter2[1]._2_2_ = local_948._2_2_;
  filter2[1]._4_2_ = local_948._4_2_;
  filter2[1]._6_2_ = local_948._6_2_;
  filter1[0]._0_2_ = local_948._8_2_;
  filter1[0]._2_2_ = local_948._10_2_;
  filter1[0]._4_2_ = local_948._12_2_;
  filter1[0]._6_2_ = local_948._14_2_;
  local_948._0_2_ =
       (ushort)(local_108 < (short)filter2[1]) * local_108 |
       (ushort)(local_108 >= (short)filter2[1]) * (short)filter2[1];
  local_948._2_2_ =
       (ushort)(sStack_106 < filter2[1]._2_2_) * sStack_106 |
       (ushort)(sStack_106 >= filter2[1]._2_2_) * filter2[1]._2_2_;
  local_948._4_2_ =
       (ushort)(sStack_104 < filter2[1]._4_2_) * sStack_104 |
       (ushort)(sStack_104 >= filter2[1]._4_2_) * filter2[1]._4_2_;
  local_948._6_2_ =
       (ushort)(sStack_102 < filter2[1]._6_2_) * sStack_102 |
       (ushort)(sStack_102 >= filter2[1]._6_2_) * filter2[1]._6_2_;
  local_948._8_2_ =
       (ushort)(sStack_100 < (short)filter1[0]) * sStack_100 |
       (ushort)(sStack_100 >= (short)filter1[0]) * (short)filter1[0];
  local_948._10_2_ =
       (ushort)(sStack_fe < filter1[0]._2_2_) * sStack_fe |
       (ushort)(sStack_fe >= filter1[0]._2_2_) * filter1[0]._2_2_;
  local_948._12_2_ =
       (ushort)(sStack_fc < filter1[0]._4_2_) * sStack_fc |
       (ushort)(sStack_fc >= filter1[0]._4_2_) * filter1[0]._4_2_;
  local_948._14_2_ =
       (ushort)(sStack_fa < filter1[0]._6_2_) * sStack_fa |
       (ushort)(sStack_fa >= filter1[0]._6_2_) * filter1[0]._6_2_;
  local_3f8 = local_948._0_2_;
  sStack_3f6 = local_948._2_2_;
  sStack_3f4 = local_948._4_2_;
  sStack_3f2 = local_948._6_2_;
  sStack_3f0 = local_948._8_2_;
  sStack_3ee = local_948._10_2_;
  sStack_3ec = local_948._12_2_;
  sStack_3ea = local_948._14_2_;
  local_948._0_2_ =
       (ushort)(local_3f8 < local_308) * local_308 | (ushort)(local_3f8 >= local_308) * local_3f8;
  local_948._2_2_ =
       (ushort)(sStack_3f6 < sStack_306) * sStack_306 |
       (ushort)(sStack_3f6 >= sStack_306) * sStack_3f6;
  local_948._4_2_ =
       (ushort)(sStack_3f4 < sStack_304) * sStack_304 |
       (ushort)(sStack_3f4 >= sStack_304) * sStack_3f4;
  local_948._6_2_ =
       (ushort)(sStack_3f2 < sStack_302) * sStack_302 |
       (ushort)(sStack_3f2 >= sStack_302) * sStack_3f2;
  local_948._8_2_ =
       (ushort)(sStack_3f0 < sStack_300) * sStack_300 |
       (ushort)(sStack_3f0 >= sStack_300) * sStack_3f0;
  local_948._10_2_ =
       (ushort)(sStack_3ee < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_3ee >= sStack_2fe) * sStack_3ee;
  local_948._12_2_ =
       (ushort)(sStack_3ec < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_3ec >= sStack_2fc) * sStack_3ec;
  local_948._14_2_ =
       (ushort)(sStack_3ea < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_3ea >= sStack_2fa) * sStack_3ea;
  local_928 = paddsw(auVar8,auVar14);
  t4[1]._0_2_ = local_928._0_2_;
  t4[1]._2_2_ = local_928._2_2_;
  t4[1]._4_2_ = local_928._4_2_;
  t4[1]._6_2_ = local_928._6_2_;
  t3[0]._0_2_ = local_928._8_2_;
  t3[0]._2_2_ = local_928._10_2_;
  t3[0]._4_2_ = local_928._12_2_;
  t3[0]._6_2_ = local_928._14_2_;
  local_928._0_2_ =
       (ushort)(local_108 < (short)t4[1]) * local_108 |
       (ushort)(local_108 >= (short)t4[1]) * (short)t4[1];
  local_928._2_2_ =
       (ushort)(sStack_106 < t4[1]._2_2_) * sStack_106 |
       (ushort)(sStack_106 >= t4[1]._2_2_) * t4[1]._2_2_;
  local_928._4_2_ =
       (ushort)(sStack_104 < t4[1]._4_2_) * sStack_104 |
       (ushort)(sStack_104 >= t4[1]._4_2_) * t4[1]._4_2_;
  local_928._6_2_ =
       (ushort)(sStack_102 < t4[1]._6_2_) * sStack_102 |
       (ushort)(sStack_102 >= t4[1]._6_2_) * t4[1]._6_2_;
  local_928._8_2_ =
       (ushort)(sStack_100 < (short)t3[0]) * sStack_100 |
       (ushort)(sStack_100 >= (short)t3[0]) * (short)t3[0];
  local_928._10_2_ =
       (ushort)(sStack_fe < t3[0]._2_2_) * sStack_fe |
       (ushort)(sStack_fe >= t3[0]._2_2_) * t3[0]._2_2_;
  local_928._12_2_ =
       (ushort)(sStack_fc < t3[0]._4_2_) * sStack_fc |
       (ushort)(sStack_fc >= t3[0]._4_2_) * t3[0]._4_2_;
  local_928._14_2_ =
       (ushort)(sStack_fa < t3[0]._6_2_) * sStack_fa |
       (ushort)(sStack_fa >= t3[0]._6_2_) * t3[0]._6_2_;
  local_438 = local_928._0_2_;
  sStack_436 = local_928._2_2_;
  sStack_434 = local_928._4_2_;
  sStack_432 = local_928._6_2_;
  sStack_430 = local_928._8_2_;
  sStack_42e = local_928._10_2_;
  sStack_42c = local_928._12_2_;
  sStack_42a = local_928._14_2_;
  local_928._0_2_ =
       (ushort)(local_438 < local_308) * local_308 | (ushort)(local_438 >= local_308) * local_438;
  local_928._2_2_ =
       (ushort)(sStack_436 < sStack_306) * sStack_306 |
       (ushort)(sStack_436 >= sStack_306) * sStack_436;
  local_928._4_2_ =
       (ushort)(sStack_434 < sStack_304) * sStack_304 |
       (ushort)(sStack_434 >= sStack_304) * sStack_434;
  local_928._6_2_ =
       (ushort)(sStack_432 < sStack_302) * sStack_302 |
       (ushort)(sStack_432 >= sStack_302) * sStack_432;
  local_928._8_2_ =
       (ushort)(sStack_430 < sStack_300) * sStack_300 |
       (ushort)(sStack_430 >= sStack_300) * sStack_430;
  local_928._10_2_ =
       (ushort)(sStack_42e < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_42e >= sStack_2fe) * sStack_42e;
  local_928._12_2_ =
       (ushort)(sStack_42c < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_42c >= sStack_2fc) * sStack_42c;
  local_928._14_2_ =
       (ushort)(sStack_42a < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_42a >= sStack_2fa) * sStack_42a;
  auVar14 = paddsw(local_948,*(undefined1 (*) [16])hev[0]);
  *in_RCX = auVar14;
  auVar14 = paddsw(local_928,*(undefined1 (*) [16])hev[0]);
  *in_RDX = auVar14;
  auVar10._8_8_ = 0x1000100010001;
  auVar10._0_8_ = 0x1000100010001;
  auVar13 = paddsw(auVar13,auVar10);
  auVar13 = psraw(auVar13,ZEXT416(1));
  local_838 = (uint)uVar7;
  uStack_834 = (uint)(uVar7 >> 0x20);
  uStack_830 = (uint)uVar12;
  uStack_82c = (uint)(uVar12 >> 0x20);
  local_848 = auVar13._0_4_;
  uStack_844 = auVar13._4_4_;
  uStack_840 = auVar13._8_4_;
  uStack_83c = auVar13._12_4_;
  local_9a8._4_4_ = (uStack_834 ^ 0xffffffff) & uStack_844;
  local_9a8._0_4_ = (local_838 ^ 0xffffffff) & local_848;
  local_9a8._8_4_ = (uStack_830 ^ 0xffffffff) & uStack_840;
  local_9a8._12_4_ = (uStack_82c ^ 0xffffffff) & uStack_83c;
  auVar8._8_8_ = local_9a8._8_8_;
  auVar8._0_8_ = local_9a8._0_8_;
  local_958 = psubsw(auVar11,auVar8);
  x[1]._0_2_ = local_958._0_2_;
  x[1]._2_2_ = local_958._2_2_;
  x[1]._4_2_ = local_958._4_2_;
  x[1]._6_2_ = local_958._6_2_;
  ffff[0]._0_2_ = local_958._8_2_;
  ffff[0]._2_2_ = local_958._10_2_;
  ffff[0]._4_2_ = local_958._12_2_;
  ffff[0]._6_2_ = local_958._14_2_;
  local_958._0_2_ =
       (ushort)(local_108 < (short)x[1]) * local_108 |
       (ushort)(local_108 >= (short)x[1]) * (short)x[1];
  local_958._2_2_ =
       (ushort)(sStack_106 < x[1]._2_2_) * sStack_106 |
       (ushort)(sStack_106 >= x[1]._2_2_) * x[1]._2_2_;
  local_958._4_2_ =
       (ushort)(sStack_104 < x[1]._4_2_) * sStack_104 |
       (ushort)(sStack_104 >= x[1]._4_2_) * x[1]._4_2_;
  local_958._6_2_ =
       (ushort)(sStack_102 < x[1]._6_2_) * sStack_102 |
       (ushort)(sStack_102 >= x[1]._6_2_) * x[1]._6_2_;
  local_958._8_2_ =
       (ushort)(sStack_100 < (short)ffff[0]) * sStack_100 |
       (ushort)(sStack_100 >= (short)ffff[0]) * (short)ffff[0];
  local_958._10_2_ =
       (ushort)(sStack_fe < ffff[0]._2_2_) * sStack_fe |
       (ushort)(sStack_fe >= ffff[0]._2_2_) * ffff[0]._2_2_;
  local_958._12_2_ =
       (ushort)(sStack_fc < ffff[0]._4_2_) * sStack_fc |
       (ushort)(sStack_fc >= ffff[0]._4_2_) * ffff[0]._4_2_;
  local_958._14_2_ =
       (ushort)(sStack_fa < ffff[0]._6_2_) * sStack_fa |
       (ushort)(sStack_fa >= ffff[0]._6_2_) * ffff[0]._6_2_;
  local_478 = local_958._0_2_;
  sStack_476 = local_958._2_2_;
  sStack_474 = local_958._4_2_;
  sStack_472 = local_958._6_2_;
  sStack_470 = local_958._8_2_;
  sStack_46e = local_958._10_2_;
  sStack_46c = local_958._12_2_;
  sStack_46a = local_958._14_2_;
  local_958._0_2_ =
       (ushort)(local_478 < local_308) * local_308 | (ushort)(local_478 >= local_308) * local_478;
  local_958._2_2_ =
       (ushort)(sStack_476 < sStack_306) * sStack_306 |
       (ushort)(sStack_476 >= sStack_306) * sStack_476;
  local_958._4_2_ =
       (ushort)(sStack_474 < sStack_304) * sStack_304 |
       (ushort)(sStack_474 >= sStack_304) * sStack_474;
  local_958._6_2_ =
       (ushort)(sStack_472 < sStack_302) * sStack_302 |
       (ushort)(sStack_472 >= sStack_302) * sStack_472;
  local_958._8_2_ =
       (ushort)(sStack_470 < sStack_300) * sStack_300 |
       (ushort)(sStack_470 >= sStack_300) * sStack_470;
  local_958._10_2_ =
       (ushort)(sStack_46e < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_46e >= sStack_2fe) * sStack_46e;
  local_958._12_2_ =
       (ushort)(sStack_46c < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_46c >= sStack_2fc) * sStack_46c;
  local_958._14_2_ =
       (ushort)(sStack_46a < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_46a >= sStack_2fa) * sStack_46a;
  local_938 = paddsw(auVar9,local_9a8);
  h[1]._0_2_ = local_938._0_2_;
  h[1]._2_2_ = local_938._2_2_;
  h[1]._4_2_ = local_938._4_2_;
  h[1]._6_2_ = local_938._6_2_;
  abs_q1q0[0]._0_2_ = local_938._8_2_;
  abs_q1q0[0]._2_2_ = local_938._10_2_;
  abs_q1q0[0]._4_2_ = local_938._12_2_;
  abs_q1q0[0]._6_2_ = local_938._14_2_;
  local_938._0_2_ =
       (ushort)(local_108 < (short)h[1]) * local_108 |
       (ushort)(local_108 >= (short)h[1]) * (short)h[1];
  local_938._2_2_ =
       (ushort)(sStack_106 < h[1]._2_2_) * sStack_106 |
       (ushort)(sStack_106 >= h[1]._2_2_) * h[1]._2_2_;
  local_938._4_2_ =
       (ushort)(sStack_104 < h[1]._4_2_) * sStack_104 |
       (ushort)(sStack_104 >= h[1]._4_2_) * h[1]._4_2_;
  local_938._6_2_ =
       (ushort)(sStack_102 < h[1]._6_2_) * sStack_102 |
       (ushort)(sStack_102 >= h[1]._6_2_) * h[1]._6_2_;
  local_938._8_2_ =
       (ushort)(sStack_100 < (short)abs_q1q0[0]) * sStack_100 |
       (ushort)(sStack_100 >= (short)abs_q1q0[0]) * (short)abs_q1q0[0];
  local_938._10_2_ =
       (ushort)(sStack_fe < abs_q1q0[0]._2_2_) * sStack_fe |
       (ushort)(sStack_fe >= abs_q1q0[0]._2_2_) * abs_q1q0[0]._2_2_;
  local_938._12_2_ =
       (ushort)(sStack_fc < abs_q1q0[0]._4_2_) * sStack_fc |
       (ushort)(sStack_fc >= abs_q1q0[0]._4_2_) * abs_q1q0[0]._4_2_;
  local_938._14_2_ =
       (ushort)(sStack_fa < abs_q1q0[0]._6_2_) * sStack_fa |
       (ushort)(sStack_fa >= abs_q1q0[0]._6_2_) * abs_q1q0[0]._6_2_;
  local_4b8 = local_938._0_2_;
  sStack_4b6 = local_938._2_2_;
  sStack_4b4 = local_938._4_2_;
  sStack_4b2 = local_938._6_2_;
  sStack_4b0 = local_938._8_2_;
  sStack_4ae = local_938._10_2_;
  sStack_4ac = local_938._12_2_;
  sStack_4aa = local_938._14_2_;
  local_938._0_2_ =
       (ushort)(local_4b8 < local_308) * local_308 | (ushort)(local_4b8 >= local_308) * local_4b8;
  local_938._2_2_ =
       (ushort)(sStack_4b6 < sStack_306) * sStack_306 |
       (ushort)(sStack_4b6 >= sStack_306) * sStack_4b6;
  local_938._4_2_ =
       (ushort)(sStack_4b4 < sStack_304) * sStack_304 |
       (ushort)(sStack_4b4 >= sStack_304) * sStack_4b4;
  local_938._6_2_ =
       (ushort)(sStack_4b2 < sStack_302) * sStack_302 |
       (ushort)(sStack_4b2 >= sStack_302) * sStack_4b2;
  local_938._8_2_ =
       (ushort)(sStack_4b0 < sStack_300) * sStack_300 |
       (ushort)(sStack_4b0 >= sStack_300) * sStack_4b0;
  local_938._10_2_ =
       (ushort)(sStack_4ae < sStack_2fe) * sStack_2fe |
       (ushort)(sStack_4ae >= sStack_2fe) * sStack_4ae;
  local_938._12_2_ =
       (ushort)(sStack_4ac < sStack_2fc) * sStack_2fc |
       (ushort)(sStack_4ac >= sStack_2fc) * sStack_4ac;
  local_938._14_2_ =
       (ushort)(sStack_4aa < sStack_2fa) * sStack_2fa |
       (ushort)(sStack_4aa >= sStack_2fa) * sStack_4aa;
  auVar13 = paddsw(local_958,*(undefined1 (*) [16])hev[0]);
  in_RCX[1] = auVar13;
  auVar13 = paddsw(local_938,*(undefined1 (*) [16])hev[0]);
  in_RDX[1] = auVar13;
  return;
}

Assistant:

static inline void highbd_filter4_dual_sse2(__m128i *p, __m128i *q, __m128i *ps,
                                            __m128i *qs, const __m128i *mask,
                                            const __m128i *th, int bd,
                                            __m128i *t80) {
  __m128i ps0 = _mm_subs_epi16(p[0], *t80);
  __m128i ps1 = _mm_subs_epi16(p[1], *t80);
  __m128i qs0 = _mm_subs_epi16(q[0], *t80);
  __m128i qs1 = _mm_subs_epi16(q[1], *t80);
  const __m128i one = _mm_set1_epi16(1);
  const __m128i pmax =
      _mm_subs_epi16(_mm_subs_epi16(_mm_slli_epi16(one, bd), one), *t80);

  const __m128i zero = _mm_setzero_si128();
  const __m128i pmin = _mm_subs_epi16(zero, *t80);
  __m128i filter = _mm_subs_epi16(ps1, qs1);
  pixel_clamp(&pmin, &pmax, &filter);

  // hev_filter
  __m128i hev;
  const __m128i abs_p1p0 = abs_diff16(p[1], p[0]);
  const __m128i abs_q1q0 = abs_diff16(q[1], q[0]);
  __m128i h = _mm_max_epi16(abs_p1p0, abs_q1q0);
  h = _mm_subs_epu16(h, *th);
  const __m128i ffff = _mm_cmpeq_epi16(h, h);
  hev = _mm_xor_si128(_mm_cmpeq_epi16(h, zero), ffff);

  filter = _mm_and_si128(filter, hev);

  const __m128i x = _mm_subs_epi16(qs0, ps0);
  filter = _mm_adds_epi16(filter, x);
  filter = _mm_adds_epi16(filter, x);
  filter = _mm_adds_epi16(filter, x);
  pixel_clamp(&pmin, &pmax, &filter);
  filter = _mm_and_si128(filter, *mask);
  const __m128i t3 = _mm_set1_epi16(3);
  const __m128i t4 = _mm_set1_epi16(4);
  __m128i filter1 = _mm_adds_epi16(filter, t4);
  __m128i filter2 = _mm_adds_epi16(filter, t3);
  pixel_clamp(&pmin, &pmax, &filter1);
  pixel_clamp(&pmin, &pmax, &filter2);
  filter1 = _mm_srai_epi16(filter1, 3);
  filter2 = _mm_srai_epi16(filter2, 3);
  qs0 = _mm_subs_epi16(qs0, filter1);
  pixel_clamp(&pmin, &pmax, &qs0);
  ps0 = _mm_adds_epi16(ps0, filter2);
  pixel_clamp(&pmin, &pmax, &ps0);
  qs[0] = _mm_adds_epi16(qs0, *t80);
  ps[0] = _mm_adds_epi16(ps0, *t80);
  filter = _mm_adds_epi16(filter1, one);
  filter = _mm_srai_epi16(filter, 1);
  filter = _mm_andnot_si128(hev, filter);
  qs1 = _mm_subs_epi16(qs1, filter);
  pixel_clamp(&pmin, &pmax, &qs1);
  ps1 = _mm_adds_epi16(ps1, filter);
  pixel_clamp(&pmin, &pmax, &ps1);
  qs[1] = _mm_adds_epi16(qs1, *t80);
  ps[1] = _mm_adds_epi16(ps1, *t80);
}